

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexReader.cpp
# Opt level: O3

void __thiscall
Ptex::v2_2::PtexReader::readLargeMetaDataHeaders
          (PtexReader *this,MetaData *metadata,FilePos pos,int zipsize,int memsize,
          size_t *metaDataMemUsed)

{
  byte bVar1;
  byte datatype;
  uint32_t datasize;
  uint uVar2;
  MetaData *this_00;
  bool bVar3;
  byte *pbVar4;
  Entry *pEVar5;
  byte *pbVar6;
  byte **ppbVar7;
  long lVar8;
  byte *local_58;
  FilePos local_50;
  MetaData *local_48;
  byte *local_40;
  int local_34;
  
  local_50 = pos;
  local_48 = metadata;
  seek(this,pos);
  if (memsize < 0x4001) {
    pbVar4 = (byte *)((long)&local_58 - ((long)memsize + 0xfU & 0xfffffffffffffff0));
    ppbVar7 = (byte **)pbVar4;
  }
  else {
    pbVar4 = (byte *)operator_new__((ulong)(uint)memsize);
    ppbVar7 = &local_58;
  }
  local_40 = pbVar4;
  local_34 = memsize;
  *(byte *)((long)ppbVar7 + -8) = 0x71;
  *(byte *)((long)ppbVar7 + -7) = 0x10;
  *(byte *)((long)ppbVar7 + -6) = 0x11;
  *(byte *)((long)ppbVar7 + -5) = 0;
  *(byte *)((long)ppbVar7 + -4) = 0;
  *(byte *)((long)ppbVar7 + -3) = 0;
  *(byte *)((long)ppbVar7 + -2) = 0;
  *(byte *)((long)ppbVar7 + -1) = 0;
  bVar3 = readZipBlock(this,pbVar4,zipsize,memsize);
  this_00 = local_48;
  if (bVar3) {
    if (local_34 < 1) {
      return;
    }
    local_58 = local_40 + memsize;
    lVar8 = zipsize + local_50;
    pbVar4 = local_40;
    do {
      bVar1 = *pbVar4;
      pbVar6 = pbVar4 + (ulong)bVar1 + 10;
      datatype = pbVar4[(ulong)bVar1 + 1];
      datasize = *(uint32_t *)(pbVar4 + (ulong)bVar1 + 2);
      uVar2 = *(uint *)(pbVar4 + (ulong)bVar1 + 6);
      *(byte *)((long)ppbVar7 + -8) = 0xbe;
      *(byte *)((long)ppbVar7 + -7) = 0x10;
      *(byte *)((long)ppbVar7 + -6) = 0x11;
      *(byte *)((long)ppbVar7 + -5) = 0;
      *(byte *)((long)ppbVar7 + -4) = 0;
      *(byte *)((long)ppbVar7 + -3) = 0;
      *(byte *)((long)ppbVar7 + -2) = 0;
      *(byte *)((long)ppbVar7 + -1) = 0;
      pEVar5 = MetaData::newEntry(this_00,bVar1 - 1,(char *)(pbVar4 + 1),datatype,datasize,
                                  metaDataMemUsed);
      pEVar5->isLmd = true;
      pEVar5->lmdData = (LargeMetaData *)0x0;
      pEVar5->lmdPos = lVar8;
      pEVar5->lmdZipSize = uVar2;
      lVar8 = lVar8 + (ulong)uVar2;
      pbVar4 = pbVar6;
    } while (pbVar6 < local_58);
  }
  pbVar4 = local_40;
  if (0x4000 < local_34) {
    *(byte *)((long)ppbVar7 + -8) = 0xed;
    *(byte *)((long)ppbVar7 + -7) = 0x10;
    *(byte *)((long)ppbVar7 + -6) = 0x11;
    *(byte *)((long)ppbVar7 + -5) = 0;
    *(byte *)((long)ppbVar7 + -4) = 0;
    *(byte *)((long)ppbVar7 + -3) = 0;
    *(byte *)((long)ppbVar7 + -2) = 0;
    *(byte *)((long)ppbVar7 + -1) = 0;
    operator_delete__(pbVar4);
  }
  return;
}

Assistant:

void PtexReader::readLargeMetaDataHeaders(MetaData* metadata, FilePos pos, int zipsize, int memsize, size_t& metaDataMemUsed)
{
    seek(pos);
    // read from file
    bool useNew = memsize > AllocaMax;
    char* buff = useNew ? new char [memsize] : (char*)alloca(memsize);

    if (readZipBlock(buff, zipsize, memsize)) {
        pos += zipsize;

        // unpack data entries
        char* ptr = buff;
        char* end = ptr + memsize;
        while (ptr < end) {
            uint8_t keysize = *ptr++;
            char* key = (char*)ptr; ptr += keysize;
            uint8_t datatypeval = *ptr++;
            uint32_t datasize; memcpy(&datasize, ptr, sizeof(datasize));
            ptr += sizeof(datasize);
            uint32_t zipsizeval; memcpy(&zipsizeval, ptr, sizeof(zipsizeval));
            ptr += sizeof(zipsizeval);
            metadata->addLmdEntry((uint8_t)(keysize-1), key, datatypeval, datasize, pos, zipsizeval, metaDataMemUsed);
            pos += zipsizeval;
        }
    }
    if (useNew) delete [] buff;
}